

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O2

EventInfo * __thiscall
C3DFile::getEventInfo(EventInfo *__return_storage_ptr__,C3DFile *this,size_t index)

{
  size_t sVar1;
  size_t j_1;
  ulong uVar2;
  long lVar3;
  size_t j;
  ulong uVar4;
  DataMatrix<char> labels_data;
  DataMatrix<char> contexts_data;
  string label;
  string context;
  ParameterInfo labels_info;
  ParameterInfo times_info;
  DataMatrix<float> times_data;
  ParameterInfo contexts_info;
  
  sVar1 = getEventCount(this);
  if (index < sVar1) {
    EventInfo::EventInfo(__return_storage_ptr__);
    getParamInfo(&contexts_info,this,"EVENT:CONTEXTS");
    contexts_data.rows = (size_t)contexts_info.dimensions[1];
    contexts_data.columns = (size_t)*contexts_info.dimensions;
    uVar2 = contexts_data.columns * contexts_data.rows;
    contexts_data.raw_data = (char *)operator_new__(uVar2);
    memcpy(contexts_data.raw_data,contexts_info.char_data,uVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&context,"",(allocator<char> *)&labels_info);
    for (uVar2 = 0; uVar2 < contexts_data.columns; uVar2 = uVar2 + 1) {
      std::__cxx11::string::push_back((char)&context);
    }
    std::__cxx11::string::find_last_not_of((char)&context,0x20);
    std::__cxx11::string::substr((ulong)&labels_info,(ulong)&context);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->context,(string *)&labels_info);
    std::__cxx11::string::~string((string *)&labels_info);
    getParamInfo(&labels_info,this,"EVENT:LABELS");
    labels_data.rows = (size_t)labels_info.dimensions[1];
    uVar2 = (ulong)*labels_info.dimensions;
    uVar4 = labels_data.rows * uVar2;
    labels_data.columns = uVar2;
    labels_data.raw_data = (char *)operator_new__(uVar4);
    memcpy(labels_data.raw_data,labels_info.char_data,uVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&label,"",(allocator<char> *)&times_info);
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      std::__cxx11::string::push_back((char)&label);
      uVar2 = labels_data.columns;
    }
    std::__cxx11::string::find_last_not_of((char)&label,0x20);
    std::__cxx11::string::substr((ulong)&times_info,(ulong)&label);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&times_info);
    std::__cxx11::string::~string((string *)&times_info);
    getParamInfo(&times_info,this,"EVENT:TIMES");
    DataMatrix<float>::DataMatrix
              (&times_data,(uint)times_info.dimensions[1],(uint)*times_info.dimensions);
    memcpy(times_data.raw_data,times_info.float_data,times_data.rows * times_data.columns * 4);
    lVar3 = (index & 0xffffffff) * times_data.columns;
    __return_storage_ptr__->time_minutes = times_data.raw_data[lVar3];
    __return_storage_ptr__->time_seconds = times_data.raw_data[lVar3 + 1];
    DataMatrix<float>::~DataMatrix(&times_data);
    ParameterInfo::~ParameterInfo(&times_info);
    std::__cxx11::string::~string((string *)&label);
    DataMatrix<char>::~DataMatrix(&labels_data);
    ParameterInfo::~ParameterInfo(&labels_info);
    std::__cxx11::string::~string((string *)&context);
    DataMatrix<char>::~DataMatrix(&contexts_data);
    ParameterInfo::~ParameterInfo(&contexts_info);
    return __return_storage_ptr__;
  }
  __assert_fail("getEventCount() > index",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x3d,"EventInfo C3DFile::getEventInfo(size_t)");
}

Assistant:

EventInfo C3DFile::getEventInfo (size_t index) {
	assert (getEventCount() > index);

	EventInfo result;

	ParameterInfo contexts_info = getParamInfo ("EVENT:CONTEXTS");
	DataMatrix<char> contexts_data (
			static_cast<unsigned int>(contexts_info.dimensions[1]),
			static_cast<unsigned int>(contexts_info.dimensions[0])
			);

	contexts_data.CopyFrom (contexts_info.char_data);
	string context = "";
	for (size_t j = 0; j < contexts_data.GetColumns(); j++) {
		context += contexts_data(index, j);
	}
	result.context = context.substr (0, context.find_last_not_of(' ') + 1);

	ParameterInfo labels_info = getParamInfo ("EVENT:LABELS");
	DataMatrix<char> labels_data (
			static_cast<unsigned int>(labels_info.dimensions[1]),
			static_cast<unsigned int>(labels_info.dimensions[0])
			);

	labels_data.CopyFrom (labels_info.char_data);
	string label = "";
	for (size_t j = 0; j < labels_data.GetColumns(); j++) {
		label += labels_data(index, j);
	}
	result.label = label.substr (0, label.find_last_not_of(' ') + 1);

	ParameterInfo times_info = getParamInfo ("EVENT:TIMES");
	DataMatrix<float> times_data (
			static_cast<unsigned int>(times_info.dimensions[1]),
			static_cast<unsigned int>(times_info.dimensions[0])
			);

	times_data.CopyFrom (times_info.float_data);
	result.time_minutes = times_data(index, 0);
	result.time_seconds = times_data(index, 1);

	return result;
}